

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O2

Instr * __thiscall LowererMD::Simd128LowerLessThan(LowererMD *this,Instr *instr)

{
  OpCode OVar1;
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RegOpnd *dstOpnd;
  RegOpnd *dstOpnd_00;
  intptr_t iVar5;
  MemRefOpnd *pMVar6;
  RegOpnd *dstOpnd_01;
  Instr *pIVar7;
  OpCode local_32;
  
  OVar1 = instr->m_opcode;
  if ((((0x24 < OVar1 - 0x362) || ((0x1200000009U >> ((ulong)(OVar1 - 0x362) & 0x3f) & 1) == 0)) &&
      (OVar1 != Simd128_Lt_U16)) && (OVar1 != Simd128_GtEq_U16)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x730,
                       "(instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)"
                       ,
                       "instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16"
                      );
    if (!bVar3) goto LAB_005efb4b;
    *puVar4 = 0;
  }
  this_00 = instr->m_dst;
  this_01 = instr->m_src1;
  this_02 = instr->m_src2;
  bVar3 = IR::Opnd::IsRegOpnd(this_00);
  if ((!bVar3) || (2 < (byte)(this_00->m_type - TySimd128B4))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x736,
                       "(dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16()))"
                       ,
                       "dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16())"
                      );
    if (!bVar3) goto LAB_005efb4b;
    *puVar4 = 0;
  }
  bVar3 = IR::Opnd::IsRegOpnd(this_01);
  if (bVar3) {
    bVar3 = IR::Opnd::IsSimd128(this_01);
    if (!bVar3) goto LAB_005ef7f3;
  }
  else {
LAB_005ef7f3:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x737,"(src1->IsRegOpnd() && src1->IsSimd128())",
                       "src1->IsRegOpnd() && src1->IsSimd128()");
    if (!bVar3) goto LAB_005efb4b;
    *puVar4 = 0;
  }
  bVar3 = IR::Opnd::IsRegOpnd(this_02);
  if (bVar3) {
    bVar3 = IR::Opnd::IsSimd128(this_02);
    if (!bVar3) goto LAB_005ef85f;
  }
  else {
LAB_005ef85f:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x738,"(src2->IsRegOpnd() && src2->IsSimd128())",
                       "src2->IsRegOpnd() && src2->IsSimd128()");
    if (!bVar3) {
LAB_005efb4b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  dstOpnd = IR::RegOpnd::New(this_01->m_type,this->m_func);
  dstOpnd_00 = IR::RegOpnd::New(this_01->m_type,this->m_func);
  iVar5 = ThreadContextInfo::GetX86DoubleWordSignBitsAddr(this->m_func->m_threadContextInfo);
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
  dstOpnd_01 = IR::RegOpnd::New(TySimd128I4,this->m_func);
  OVar1 = instr->m_opcode;
  if (OVar1 == Simd128_Lt_U8) {
LAB_005ef93e:
    iVar5 = ThreadContextInfo::GetX86WordSignBitsAddr(this->m_func->m_threadContextInfo);
    local_32 = PCMPGTW;
  }
  else {
    if ((OVar1 != Simd128_GtEq_U16) && (OVar1 != Simd128_Lt_U16)) {
      if (OVar1 != Simd128_GtEq_U8) {
        local_32 = PCMPGTD;
        goto LAB_005ef9eb;
      }
      goto LAB_005ef93e;
    }
    iVar5 = ThreadContextInfo::GetX86ByteSignBitsAddr(this->m_func->m_threadContextInfo);
    local_32 = PCMPGTB;
  }
  pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
LAB_005ef9eb:
  pIVar7 = IR::Instr::New(MOVUPS,&dstOpnd_01->super_Opnd,&pMVar6->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(PXOR,&dstOpnd->super_Opnd,this_01,&dstOpnd_01->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(PXOR,&dstOpnd_00->super_Opnd,this_02,&dstOpnd_01->super_Opnd,this->m_func)
  ;
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  pIVar7 = IR::Instr::New(local_32,this_00,&dstOpnd_00->super_Opnd,&dstOpnd->super_Opnd,this->m_func
                         );
  IR::Instr::InsertBefore(instr,pIVar7);
  Legalize<false>(pIVar7,false);
  OVar1 = instr->m_opcode;
  if (((OVar1 == Simd128_GtEq_U4) || (OVar1 == Simd128_GtEq_U16)) || (OVar1 == Simd128_GtEq_U8)) {
    iVar5 = ThreadContextInfo::GetX86AllNegOnesAddr(this->m_func->m_threadContextInfo);
    pMVar6 = IR::MemRefOpnd::New(iVar5,TySimd128I4,this->m_func,AddrOpndKindDynamicMisc);
    pIVar7 = IR::Instr::New(PANDN,this_00,this_00,&pMVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    Legalize<false>(pIVar7,false);
  }
  pIVar7 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar7;
}

Assistant:

IR::Instr* LowererMD::Simd128LowerLessThan(IR::Instr* instr)
{
    Assert(instr->m_opcode == Js::OpCode::Simd128_Lt_U4 || instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_Lt_U16 ||
        instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16);

    IR::Instr *pInstr;
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(dst->IsRegOpnd() && (dst->IsSimd128B4() || dst->IsSimd128B8() || dst->IsSimd128B16()));
    Assert(src1->IsRegOpnd() && src1->IsSimd128());
    Assert(src2->IsRegOpnd() && src2->IsSimd128());

    IR::RegOpnd* tmpa = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::RegOpnd* tmpb = IR::RegOpnd::New(src1->GetType(), m_func);

    IR::MemRefOpnd* signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86DoubleWordSignBitsAddr(), TySimd128I4, m_func);
    IR::RegOpnd * mask = IR::RegOpnd::New(TySimd128I4, m_func);

    Js::OpCode cmpOpcode = Js::OpCode::PCMPGTD;
    if (instr->m_opcode == Js::OpCode::Simd128_Lt_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8)
    {
        cmpOpcode = Js::OpCode::PCMPGTW;
        signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86WordSignBitsAddr(), TySimd128I4, m_func);
    }
    else if (instr->m_opcode == Js::OpCode::Simd128_Lt_U16 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)
    {
        cmpOpcode = Js::OpCode::PCMPGTB;
        signBits = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86ByteSignBitsAddr(), TySimd128I4, m_func);
    }

    // MOVUPS mask, [signBits]
    pInstr = IR::Instr::New(Js::OpCode::MOVUPS, mask, signBits, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // tmpa = PXOR src1, signBits
    pInstr = IR::Instr::New(Js::OpCode::PXOR, tmpa, src1, mask, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // tmpb = PXOR src2, signBits
    pInstr = IR::Instr::New(Js::OpCode::PXOR, tmpb, src2, mask, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    // dst = cmpOpCode tmpb, tmpa  (Less than, swapped opnds)
    pInstr = IR::Instr::New(cmpOpcode, dst, tmpb, tmpa, m_func);
    instr->InsertBefore(pInstr);
    Legalize(pInstr);

    if (instr->m_opcode == Js::OpCode::Simd128_GtEq_U4 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U8 || instr->m_opcode == Js::OpCode::Simd128_GtEq_U16)
    {
        // for SIMD unsigned int, greaterThanOrEqual == lessThan + Not
        // dst = PANDN dst, X86_ALL_NEG_ONES
        // MOVUPS mask, [allNegOnes]
        pInstr = IR::Instr::New(Js::OpCode::PANDN, dst, dst, IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetX86AllNegOnesAddr(), TySimd128I4, m_func), m_func);
        instr->InsertBefore(pInstr);
        Legalize(pInstr);
    }

    pInstr = instr->m_prev;
    instr->Remove();

    return pInstr;
}